

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O0

void __thiscall
phyr::ParallelForLoop::ParallelForLoop
          (ParallelForLoop *this,function<void_(phyr::Point2<int>)> *f,Point2i *count)

{
  int *in_RDX;
  function<void_(long)> *in_RDI;
  function<void_(phyr::Point2<int>)> *in_stack_ffffffffffffffd8;
  function<void_(phyr::Point2<int>)> *in_stack_ffffffffffffffe0;
  
  std::function<void_(long)>::function(in_RDI);
  std::function<void_(phyr::Point2<int>)>::function
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(long *)&in_RDI[2].super__Function_base._M_functor = (long)(*in_RDX * in_RDX[1]);
  *(undefined4 *)((long)&in_RDI[2].super__Function_base._M_functor + 8) = 1;
  in_RDI[2].super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined4 *)&in_RDI[2]._M_invoker = 0;
  *(undefined8 *)&in_RDI[3].super__Function_base._M_functor = 0;
  *(undefined4 *)((long)&in_RDI[3].super__Function_base._M_functor + 8) = 0xffffffff;
  *(int *)((long)&in_RDI[3].super__Function_base._M_functor + 8) = *in_RDX;
  return;
}

Assistant:

ParallelForLoop(const std::function<void(Point2i)>& f, const Point2i& count)
        : func2D(f), maxIndex(count.x * count.y), chunkSize(1) {
        nX = count.x;
    }